

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O2

FIOBJ fiobj_obj2json2(FIOBJ dest,FIOBJ o,uint8_t pretty)

{
  fiobj_object_vtable_s *pfVar1;
  obj2json_data_s data;
  fio_json_stack_s stack;
  
  if (((uint)dest & 7) != 2) {
    __assert_fail("dest && FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_json.c"
                  ,0x1a3,"FIOBJ fiobj_obj2json2(FIOBJ, FIOBJ, uint8_t)");
  }
  if (o == 0) {
    fiobj_str_write(dest,"null",4);
    dest = 0;
  }
  else {
    data.stack = &stack;
    stack.capa = 0;
    stack.arry = (FIOBJ *)0x0;
    stack.start = 0;
    stack.end = 0;
    data.parent = 0;
    data.count = 1;
    data.dest = dest;
    data.pretty = pretty;
    if (((~(uint)o & 6) != 0 && (o & 1) == 0) &&
       (pfVar1 = fiobj_type_vtable(o),
       pfVar1->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)) {
      fiobj_each2(o,fiobj_obj2json_task,&data);
      fio_json_stack_free(&stack);
      return dest;
    }
    fiobj_obj2json_task(o,&data);
  }
  return dest;
}

Assistant:

FIOBJ fiobj_obj2json2(FIOBJ dest, FIOBJ o, uint8_t pretty) {
  assert(dest && FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (!o) {
    fiobj_str_write(dest, "null", 4);
    return 0;
  }
  fio_json_stack_s stack = FIO_ARY_INIT;
  obj2json_data_s data = {
      .dest = dest,
      .stack = &stack,
      .pretty = pretty,
      .count = 1,
  };
  if (!o || !FIOBJ_IS_ALLOCATED(o) || !FIOBJECT2VTBL(o)->each) {
    fiobj_obj2json_task(o, &data);
    return dest;
  }
  fiobj_each2(o, fiobj_obj2json_task, &data);
  fio_json_stack_free(&stack);
  return dest;
}